

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessExit
          (Value *__return_storage_ptr__,Interpreter *this,Expression *param_1)

{
  element_type *this_00;
  Error local_48;
  Expression *local_20;
  Expression *param_1_local;
  Interpreter *this_local;
  
  local_20 = param_1;
  param_1_local = (Expression *)this;
  this_local = (Interpreter *)__return_storage_ptr__;
  this_00 = std::
            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mJobManager);
  JobManager::StopCommissionerPool(this_00);
  this->mShouldExit = true;
  Error::Error(&local_48);
  Value::Value(__return_storage_ptr__,&local_48);
  Error::~Error(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessExit(const Expression &)
{
    mJobManager->StopCommissionerPool();

    mShouldExit = true;

    return ERROR_NONE;
}